

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TasmanianSparseGridWrapC.cpp
# Opt level: O2

void tsgSetConformalTransformASIN(void *grid,int *truncation)

{
  int in_ECX;
  int *x;
  _Vector_base<int,_std::allocator<int>_> _Stack_28;
  
  if (*(long *)((long)grid + 8) == 0) {
    x = (int *)0x0;
  }
  else {
    x = (int *)(ulong)*(uint *)(*(long *)((long)grid + 8) + 0x10);
  }
  TasGrid::Utils::copyArray<int_const,int>
            ((vector<int,_std::allocator<int>_> *)&_Stack_28,(Utils *)truncation,x,in_ECX);
  TasGrid::TasmanianSparseGrid::setConformalTransformASIN
            ((TasmanianSparseGrid *)grid,(vector<int,_std::allocator<int>_> *)&_Stack_28);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&_Stack_28);
  return;
}

Assistant:

void tsgSetConformalTransformASIN(void *grid, const int truncation[]){
    ((TasmanianSparseGrid*) grid)->setConformalTransformASIN(Utils::copyArray(truncation, ((TasmanianSparseGrid*) grid)->getNumDimensions()));
}